

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

void global_init(global *global)

{
  global *global_local;
  
  clear(global,0x60);
  *(ushort *)global = *(ushort *)global & 0xfffe;
  *(ushort *)global = *(ushort *)global & 0xfffd;
  *(ushort *)global = *(ushort *)global & 0xffe7;
  *(ushort *)global = *(ushort *)global & 0xff1f;
  global->idat_max = 0;
  *(ushort *)global = *(ushort *)global & 0xfffb;
  *(ushort *)global = *(ushort *)global & 0xf8ff;
  global->status_code = 0;
  IDAT_list_init(&global->idat_cache);
  return;
}

Assistant:

static void
global_init(struct global *global)
   /* Call this once (and only once) to initialize the control */
{
   CLEAR(*global);

   /* Globals */
   global->errors        = 0;
   global->warnings      = 0;
   global->quiet         = 0;
   global->verbose       = 0;
   global->idat_max      = 0;         /* no re-chunking of IDAT */
   global->optimize_zlib = 0;
   global->skip          = SKIP_NONE;
   global->status_code   = 0;

   IDAT_list_init(&global->idat_cache);
}